

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O2

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,uint i)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,i);
  (*this->_vptr_Pipeline[2])(this,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(unsigned int i)
{
    this->writeString(std::to_string(i));
    return *this;
}